

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O3

void __thiscall Iex_2_5::BaseExc::BaseExc(BaseExc *this,stringstream *s)

{
  *(undefined ***)this = &PTR__TypeExc_0015c328;
  std::__cxx11::stringbuf::str();
  if ((anonymous_namespace)::currentStackTracer_abi_cxx11_ == (code *)0x0) {
    (this->_stackTrace)._M_dataplus._M_p = (pointer)&(this->_stackTrace).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&this->_stackTrace,"");
  }
  else {
    (*(anonymous_namespace)::currentStackTracer_abi_cxx11_)();
  }
  return;
}

Assistant:

BaseExc::BaseExc (std::stringstream &s) throw () :
    _message (s.str()),
    _stackTrace (currentStackTracer? currentStackTracer(): "")
{
    // empty
}